

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handleTopLevelMacro
          (pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>
           *__return_storage_ptr__,Preprocessor *this,Token directive)

{
  flat_hash_set<std::string_view> *this_00;
  char *pcVar1;
  group_type_pointer pgVar2;
  undefined1 *this_01;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer pbVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  undefined8 uVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  SmallVector<slang::parsing::Token,_32UL> *__x;
  MacroActualArgumentListSyntax *pMVar13;
  uint64_t uVar14;
  Diagnostic *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Info *extraout_RDX;
  Info *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t extraout_RDX_02;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  EVP_PKEY_CTX *pEVar20;
  char cVar21;
  char cVar23;
  char cVar24;
  byte bVar25;
  undefined1 auVar22 [16];
  uchar uVar26;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  byte bVar41;
  undefined1 auVar27 [16];
  MacroDef MVar42;
  basic_string_view<char,_std::char_traits<char>_> bVar43;
  SourceRange range;
  string_view arg;
  Token TVar44;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_00;
  SmallVector<slang::parsing::Token,_32UL> *local_390;
  MacroIntrinsic local_388;
  undefined2 uStack_384;
  undefined2 uStack_382;
  Token directive_local;
  undefined1 local_370 [56];
  Trivia local_338;
  SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  alreadyExpanded;
  SmallVector<slang::parsing::Token,_32UL> buffer;
  MacroExpansion local_68;
  SmallVector<slang::parsing::Token,_32UL> *pSVar15;
  
  directive_local._0_8_ = directive._0_8_;
  directive_local.info = directive.info;
  MVar42 = findMacro(this,directive);
  __x = (SmallVector<slang::parsing::Token,_32UL> *)MVar42.syntax;
  local_388 = MVar42.intrinsic;
  uStack_384 = MVar42._12_2_;
  local_390 = __x;
  if (local_388 == None && __x == (SmallVector<slang::parsing::Token,_32UL> *)0x0) {
    this_00 = &(this->options).ignoreDirectives;
    alreadyExpanded.super_Storage.buffer._0_16_ = Token::valueText(&directive_local);
    bVar43 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&alreadyExpanded,1,
                        0xffffffffffffffff);
    buffer.super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)bVar43._M_len;
    buffer.super_SmallVectorBase<slang::parsing::Token>.len = (size_type)bVar43._M_str;
    uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00
                        ,(basic_string_view<char,_std::char_traits<char>_> *)&buffer);
    uVar19 = uVar14 >> ((byte)(this->options).ignoreDirectives.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar17 = (uVar14 & 0xff) * 4;
    uVar26 = (&UNK_0040eb5c)[lVar17];
    uVar28 = (&UNK_0040eb5d)[lVar17];
    uVar29 = (&UNK_0040eb5e)[lVar17];
    bVar25 = (&UNK_0040eb5f)[lVar17];
    uVar18 = 0;
    uVar30 = uVar26;
    uVar31 = uVar28;
    uVar32 = uVar29;
    bVar33 = bVar25;
    uVar34 = uVar26;
    uVar35 = uVar28;
    uVar36 = uVar29;
    bVar37 = bVar25;
    uVar38 = uVar26;
    uVar39 = uVar28;
    uVar40 = uVar29;
    bVar41 = bVar25;
    do {
      pgVar4 = (this->options).ignoreDirectives.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_;
      pgVar2 = pgVar4 + uVar19;
      bVar10 = pgVar2->m[0xf].n;
      auVar22[0] = -(pgVar2->m[0].n == uVar26);
      auVar22[1] = -(pgVar2->m[1].n == uVar28);
      auVar22[2] = -(pgVar2->m[2].n == uVar29);
      auVar22[3] = -(pgVar2->m[3].n == bVar25);
      auVar22[4] = -(pgVar2->m[4].n == uVar30);
      auVar22[5] = -(pgVar2->m[5].n == uVar31);
      auVar22[6] = -(pgVar2->m[6].n == uVar32);
      auVar22[7] = -(pgVar2->m[7].n == bVar33);
      auVar22[8] = -(pgVar2->m[8].n == uVar34);
      auVar22[9] = -(pgVar2->m[9].n == uVar35);
      auVar22[10] = -(pgVar2->m[10].n == uVar36);
      auVar22[0xb] = -(pgVar2->m[0xb].n == bVar37);
      auVar22[0xc] = -(pgVar2->m[0xc].n == uVar38);
      auVar22[0xd] = -(pgVar2->m[0xd].n == uVar39);
      auVar22[0xe] = -(pgVar2->m[0xe].n == uVar40);
      auVar22[0xf] = -(bVar10 == bVar41);
      uVar16 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
      if (uVar16 != 0) {
        local_370[0x19] = uVar28;
        local_370[0x18] = uVar26;
        local_370[0x1a] = uVar29;
        local_370[0x1b] = bVar25;
        local_370[0x1c] = uVar30;
        local_370[0x1d] = uVar31;
        local_370[0x1e] = uVar32;
        local_370[0x1f] = bVar33;
        pbVar5 = (this->options).ignoreDirectives.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.elements_;
        local_370[0x20] = uVar34;
        local_370[0x21] = uVar35;
        local_370[0x22] = uVar36;
        local_370[0x23] = bVar37;
        local_370[0x24] = uVar38;
        local_370[0x25] = uVar39;
        local_370[0x26] = uVar40;
        local_370[0x27] = bVar41;
        local_370._48_8_ = uVar18;
        do {
          iVar12 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
            }
          }
          __x = &buffer;
          bVar11 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_00,(basic_string_view<char,_std::char_traits<char>_> *)__x,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              ((long)&pbVar5[uVar19 * 0xf]._M_len + (ulong)(uint)(iVar12 << 4)));
          if (bVar11) {
            buffer.super_SmallVectorBase<slang::parsing::Token>.data_ =
                 (pointer)buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement;
            buffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
            buffer.super_SmallVectorBase<slang::parsing::Token>.cap = 4;
            goto LAB_00198a3c;
          }
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
        bVar10 = pgVar4[uVar19].m[0xf].n;
        uVar18 = local_370._48_8_;
        uVar26 = local_370[0x18];
        uVar28 = local_370[0x19];
        uVar29 = local_370[0x1a];
        bVar25 = local_370[0x1b];
        uVar30 = local_370[0x1c];
        uVar31 = local_370[0x1d];
        uVar32 = local_370[0x1e];
        bVar33 = local_370[0x1f];
        uVar34 = local_370[0x20];
        uVar35 = local_370[0x21];
        uVar36 = local_370[0x22];
        bVar37 = local_370[0x23];
        uVar38 = local_370[0x24];
        uVar39 = local_370[0x25];
        uVar40 = local_370[0x26];
        bVar41 = local_370[0x27];
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bVar10) == 0) break;
      uVar6 = (this->options).ignoreDirectives.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .arrays.groups_size_mask;
      lVar17 = uVar19 + uVar18;
      uVar18 = uVar18 + 1;
      uVar19 = lVar17 + 1U & uVar6;
    } while (uVar18 <= uVar6);
    range = Token::range(&directive_local);
    this_02 = addDiag(this,(DiagCode)0x1a0004,range);
    arg = Token::valueText(&directive_local);
    Diagnostic::operator<<(this_02,arg);
    TVar44 = peek(this);
    if (TVar44.kind == OpenParenthesis) {
      buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement[0] = '\0';
      buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement[1] = '\0';
      buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement[2] = '\0';
      buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement[3] = '\0';
      buffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
      buffer.super_SmallVectorBase<slang::parsing::Token>.cap = 0;
      TVar44.info = directive_local.info;
      TVar44.kind = directive_local.kind;
      TVar44._2_1_ = directive_local._2_1_;
      TVar44.numFlags.raw = directive_local.numFlags.raw;
      TVar44.rawLen = directive_local.rawLen;
      buffer.super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)this;
      pMVar13 = MacroParser::parseActualArgumentList((MacroParser *)&buffer,TVar44);
      Trivia::Trivia(&__return_storage_ptr__->second);
      __return_storage_ptr__->first = pMVar13;
      return __return_storage_ptr__;
    }
LAB_00198c75:
    Trivia::Trivia(&__return_storage_ptr__->second);
    __return_storage_ptr__->first = (MacroActualArgumentListSyntax *)0x0;
    return __return_storage_ptr__;
  }
  if ((__x == (SmallVector<slang::parsing::Token,_32UL> *)0x0) ||
     (*(long *)(__x->stackBase + 0x10) == 0)) {
    pMVar13 = (MacroActualArgumentListSyntax *)0x0;
    local_68.usageSite._0_8_ = directive._0_8_;
    local_68.usageSite.info = directive.info;
  }
  else {
    buffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
    buffer.super_SmallVectorBase<slang::parsing::Token>.cap = 0;
    buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement[0] = '\0';
    buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement[1] = '\0';
    buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement[2] = '\0';
    buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement[3] = '\0';
    buffer.super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)this;
    pMVar13 = MacroParser::parseActualArgumentList((MacroParser *)&buffer,directive);
    local_68.usageSite._0_8_ = directive_local._0_8_;
    local_68.usageSite.info = directive_local.info;
    if (pMVar13 == (MacroActualArgumentListSyntax *)0x0) goto LAB_00198c75;
  }
  buffer.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  buffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  buffer.super_SmallVectorBase<slang::parsing::Token>.cap = 0x20;
  local_68.sourceManager = this->sourceManager;
  local_68.alloc = this->alloc;
  local_68.dest = &buffer.super_SmallVectorBase<slang::parsing::Token>;
  local_68.any = false;
  local_68.isTopLevel = true;
  MVar42.builtIn = (bool)(undefined1)uStack_384;
  MVar42.commandLine = (bool)uStack_384._1_1_;
  MVar42.intrinsic = local_388;
  MVar42._14_2_ = uStack_382;
  MVar42.syntax = (DefineDirectiveSyntax *)__x;
  bVar11 = expandMacro(this,MVar42,&local_68,pMVar13);
  if (bVar11) {
    SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
    ::SmallSet(&alreadyExpanded);
    src_00 = extraout_RDX_01;
    uVar9 = local_370._24_8_;
    if (local_388 == None) {
      this_01 = &alreadyExpanded.super_Storage.field_0x48;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_390;
      uVar18 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
      src_00 = (EVP_PKEY_CTX *)(uVar18 >> (alreadyExpanded._80_1_ & 0x3f));
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar18 & 0xff];
      uVar9._0_1_ = alreadyExpanded._88_1_;
      uVar9._1_1_ = alreadyExpanded._89_1_;
      uVar9._2_1_ = alreadyExpanded._90_1_;
      uVar9._3_1_ = alreadyExpanded._91_1_;
      uVar9._4_1_ = alreadyExpanded._92_1_;
      uVar9._5_1_ = alreadyExpanded._93_1_;
      uVar9._6_1_ = alreadyExpanded._94_1_;
      uVar9._7_1_ = alreadyExpanded._95_1_;
      local_370._24_8_ = alreadyExpanded._88_8_;
      uVar19 = 0;
      pEVar20 = src_00;
      do {
        pcVar1 = (char *)(alreadyExpanded._96_8_ + (long)pEVar20 * 0x10);
        cVar21 = (char)uVar3;
        auVar27[0] = -(*pcVar1 == cVar21);
        cVar23 = (char)((uint)uVar3 >> 8);
        auVar27[1] = -(pcVar1[1] == cVar23);
        cVar24 = (char)((uint)uVar3 >> 0x10);
        auVar27[2] = -(pcVar1[2] == cVar24);
        bVar25 = (byte)((uint)uVar3 >> 0x18);
        auVar27[3] = -(pcVar1[3] == bVar25);
        auVar27[4] = -(pcVar1[4] == cVar21);
        auVar27[5] = -(pcVar1[5] == cVar23);
        auVar27[6] = -(pcVar1[6] == cVar24);
        auVar27[7] = -(pcVar1[7] == bVar25);
        auVar27[8] = -(pcVar1[8] == cVar21);
        auVar27[9] = -(pcVar1[9] == cVar23);
        auVar27[10] = -(pcVar1[10] == cVar24);
        auVar27[0xb] = -(pcVar1[0xb] == bVar25);
        auVar27[0xc] = -(pcVar1[0xc] == cVar21);
        auVar27[0xd] = -(pcVar1[0xd] == cVar23);
        auVar27[0xe] = -(pcVar1[0xe] == cVar24);
        auVar27[0xf] = -(pcVar1[0xf] == bVar25);
        uVar16 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
        if (uVar16 != 0) {
          do {
            uVar7 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if (local_390 ==
                *(SmallVector<slang::parsing::Token,_32UL> **)
                 (alreadyExpanded._104_8_ + (long)pEVar20 * 0x78 + (ulong)uVar7 * 8))
            goto LAB_00198b35;
            uVar16 = uVar16 - 1 & uVar16;
          } while (uVar16 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & pcVar1[0xf]) == 0)
        break;
        lVar17 = uVar19 + 1;
        uVar19 = uVar19 + 1;
        pEVar20 = (EVP_PKEY_CTX *)((ulong)(pEVar20 + lVar17) & alreadyExpanded._88_8_);
      } while (uVar19 <= (ulong)alreadyExpanded._88_8_);
      if ((ulong)alreadyExpanded._120_8_ < (ulong)alreadyExpanded._112_8_) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
        ::unchecked_emplace_at<slang::syntax::DefineDirectiveSyntax_const*const&>
                  ((locator *)local_370,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                    *)this_01,(size_t)src_00,uVar18,(DefineDirectiveSyntax **)&local_390);
        src_00 = extraout_RDX_03;
        uVar9 = local_370._24_8_;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
        ::unchecked_emplace_with_rehash<slang::syntax::DefineDirectiveSyntax_const*const&>
                  ((locator *)local_370,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                    *)this_01,uVar18,(DefineDirectiveSyntax **)&local_390);
        src_00 = extraout_RDX_04;
        uVar9 = local_370._24_8_;
      }
    }
LAB_00198b35:
    local_370._24_8_ = uVar9;
    iVar12 = SmallVectorBase<slang::parsing::Token>::copy
                       (&buffer.super_SmallVectorBase<slang::parsing::Token>,
                        (EVP_PKEY_CTX *)this->alloc,src_00);
    pSVar15 = (SmallVector<slang::parsing::Token,_32UL> *)CONCAT44(extraout_var_00,iVar12);
    local_370._8_8_ = extraout_RDX_02;
    while (__x = (SmallVector<slang::parsing::Token,_32UL> *)local_370, local_370._0_8_ = pSVar15,
          bVar11 = expandReplacementList
                             (this,(span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                   local_370,&alreadyExpanded), uVar9 = local_370._0_8_, bVar11) {
      (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
      tokens._M_extent._M_extent_value = local_370._8_8_;
      tokens._M_ptr = (pointer)local_370._0_8_;
      __x = (SmallVector<slang::parsing::Token,_32UL> *)local_370._0_8_;
      bVar11 = applyMacroOps(this,tokens,
                             &(this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>);
      if (!bVar11 && pSVar15 == (SmallVector<slang::parsing::Token,_32UL> *)uVar9) {
        if ((this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len != 0) {
          this->currentMacroToken =
               (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_;
        }
        Trivia::Trivia(&local_338);
        goto LAB_00198c33;
      }
      pSVar15 = (SmallVector<slang::parsing::Token,_32UL> *)
                (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_;
      local_370._8_8_ = (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len;
    }
    Trivia::Trivia(&local_338);
LAB_00198c33:
    __return_storage_ptr__->first = pMVar13;
    (__return_storage_ptr__->second).field_0.rawText.ptr = local_338.field_0.rawText.ptr;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) = local_338._8_8_;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                   *)&alreadyExpanded.super_Storage.field_0x48);
    goto LAB_00198c4e;
  }
  Trivia::Trivia((Trivia *)&alreadyExpanded);
  __return_storage_ptr__->first = pMVar13;
  goto LAB_00198be1;
LAB_00198a3c:
  bVar11 = peekSameLine(this);
  src = extraout_RDX;
  if (!bVar11) goto LAB_00198a7b;
  TVar44 = peek(this);
  src = TVar44.info;
  if (TVar44.kind == EndOfFile) goto LAB_00198a7b;
  alreadyExpanded.super_Storage.buffer._0_16_ = consume(this);
  __x = (SmallVector<slang::parsing::Token,_32UL> *)&alreadyExpanded;
  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
            (&buffer.super_SmallVectorBase<slang::parsing::Token>,(Token *)&alreadyExpanded);
  goto LAB_00198a3c;
LAB_00198a7b:
  if (buffer.super_SmallVectorBase<slang::parsing::Token>.len == 0) {
    Trivia::Trivia((Trivia *)&alreadyExpanded);
  }
  else {
    iVar12 = SmallVectorBase<slang::parsing::Token>::copy
                       (&buffer.super_SmallVectorBase<slang::parsing::Token>,
                        (EVP_PKEY_CTX *)this->alloc,(EVP_PKEY_CTX *)src);
    tokens_00._M_ptr._4_4_ = extraout_var;
    tokens_00._M_ptr._0_4_ = iVar12;
    __x = (SmallVector<slang::parsing::Token,_32UL> *)0x6;
    tokens_00._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
    Trivia::Trivia((Trivia *)&alreadyExpanded,SkippedTokens,tokens_00);
  }
  __return_storage_ptr__->first = (MacroActualArgumentListSyntax *)0x0;
LAB_00198be1:
  (__return_storage_ptr__->second).field_0.rawText.ptr =
       (char *)alreadyExpanded.super_Storage.buffer._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) =
       alreadyExpanded.super_Storage.buffer._8_8_;
LAB_00198c4e:
  SmallVectorBase<slang::parsing::Token>::cleanup
            (&buffer.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)__x);
  return __return_storage_ptr__;
}

Assistant:

std::pair<MacroActualArgumentListSyntax*, Trivia> Preprocessor::handleTopLevelMacro(
    Token directive) {
    auto macro = findMacro(directive);
    if (!macro.valid()) {
        if (options.ignoreDirectives.find(directive.valueText().substr(1)) !=
            options.ignoreDirectives.end()) {
            SmallVector<Token, 4> ignoreTokens;
            while (peekSameLine() && peek().kind != TokenKind::EndOfFile)
                ignoreTokens.push_back(consume());

            if (ignoreTokens.empty())
                return {nullptr, Trivia()};
            else
                return {nullptr, Trivia(TriviaKind::SkippedTokens, ignoreTokens.copy(alloc))};
        }
        addDiag(diag::UnknownDirective, directive.range()) << directive.valueText();

        // If we see a parenthesis next, let's assume they tried to invoke a function-like macro
        // and skip over the tokens.
        if (peek(TokenKind::OpenParenthesis))
            return {MacroParser(*this).parseActualArgumentList(directive), Trivia()};
        return {nullptr, Trivia()};
    }

    // if this assert fires, we failed to fully expand nested macros at a previous point
    SLANG_ASSERT(!currentMacroToken);

    // parse arguments if necessary
    MacroActualArgumentListSyntax* actualArgs = nullptr;
    if (macro.needsArgs()) {
        actualArgs = MacroParser(*this).parseActualArgumentList(directive);
        if (!actualArgs)
            return {nullptr, Trivia()};
    }

    // Expand out the macro
    SmallVector<Token, 32> buffer;
    MacroExpansion expansion{sourceManager, alloc, buffer, directive, true};
    if (!expandMacro(macro, expansion, actualArgs))
        return {actualArgs, Trivia()};

    // The macro is now expanded out into tokens, but some of those tokens might
    // be more macros that need to be expanded, or special characters that
    // perform stringification or concatenation of tokens. It's possible that
    // after concatentation is performed we will have formed new valid macro
    // names that need to be expanded, which is why we loop here.
    SmallSet<const DefineDirectiveSyntax*, 8> alreadyExpanded;
    if (!macro.isIntrinsic())
        alreadyExpanded.insert(macro.syntax);

    std::span<Token const> tokens = buffer.copy(alloc);
    while (true) {
        // Start by recursively expanding out all valid macro usages. We keep track of
        // the token pointer here so that we can detect if expandReplacementList actually
        // did any work; if it did we want to ensure that we come back around for another
        // pass. This ensures that we don't miss expanding a constructed macro.
        const Token* ptr = tokens.data();
        if (!expandReplacementList(tokens, alreadyExpanded))
            return {actualArgs, Trivia()};

        // Now that all macros have been expanded, handle token concatenation and stringification.
        expandedTokens.clear();
        if (!applyMacroOps(tokens, expandedTokens) && ptr == tokens.data())
            break;

        tokens = expandedTokens;
    }

    // if the macro expanded into any tokens at all, set the pointer
    // so that we'll pull from them next
    if (!expandedTokens.empty())
        currentMacroToken = expandedTokens.begin();

    return {actualArgs, Trivia()};
}